

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_wnorm
                   (char_t *s,char_t end_quote)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  
  if (((anonymous_namespace)::chartype_table[(byte)*s] & 8) == 0) {
    pbVar4 = (byte *)0x0;
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      lVar7 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (((anonymous_namespace)::chartype_table[(byte)s[lVar7]] & 8) != 0);
    s = s + lVar8;
    pbVar4 = (byte *)s;
  }
  do {
    lVar7 = lVar8;
    pbVar3 = pbVar4;
    pbVar6 = (byte *)s + 3;
    while( true ) {
      bVar2 = pbVar6[-3];
      bVar5 = (anonymous_namespace)::chartype_table[bVar2];
      if ((bVar5 & 0xc) != 0) break;
      bVar2 = pbVar6[-2];
      bVar5 = (anonymous_namespace)::chartype_table[bVar2];
      if ((bVar5 & 0xc) != 0) {
        pbVar6 = pbVar6 + -2;
        goto LAB_0015a48b;
      }
      bVar2 = pbVar6[-1];
      bVar5 = (anonymous_namespace)::chartype_table[bVar2];
      if ((bVar5 & 0xc) != 0) {
        pbVar6 = pbVar6 + -1;
        goto LAB_0015a48b;
      }
      bVar2 = *pbVar6;
      bVar5 = (anonymous_namespace)::chartype_table[bVar2];
      if ((bVar5 & 0xc) != 0) goto LAB_0015a48b;
      pbVar6 = pbVar6 + 4;
    }
    pbVar6 = pbVar6 + -3;
LAB_0015a48b:
    if (bVar2 == end_quote) {
      pbVar4 = pbVar6;
      if (pbVar3 != (byte *)0x0) {
        memmove(pbVar3 + -lVar7,pbVar3,(long)pbVar6 - (long)pbVar3);
        pbVar4 = pbVar6 + -lVar7;
      }
      do {
        *pbVar4 = 0;
        pbVar3 = pbVar4 + -1;
        pbVar4 = pbVar4 + -1;
      } while (((anonymous_namespace)::chartype_table[*pbVar3] & 8) != 0);
      return (char_t *)(pbVar6 + 1);
    }
    lVar8 = lVar7;
    pbVar4 = pbVar3;
    if ((bVar5 & 8) == 0) {
      if (bVar2 == 0) {
        return (char_t *)0x0;
      }
      s = (char_t *)(pbVar6 + 1);
    }
    else {
      pbVar1 = pbVar6 + 1;
      *pbVar6 = 0x20;
      s = (char_t *)pbVar1;
      if (((anonymous_namespace)::chartype_table[pbVar6[1]] & 8) != 0) {
        do {
          pbVar4 = (byte *)s + 1;
          s = (char_t *)((byte *)s + 1);
          lVar8 = lVar8 + 1;
        } while (((anonymous_namespace)::chartype_table[*pbVar4] & 8) != 0);
        pbVar4 = (byte *)s;
        if (pbVar3 != (byte *)0x0) {
          memmove(pbVar3 + -lVar7,pbVar3,(long)pbVar1 - (long)pbVar3);
        }
      }
    }
  } while( true );
}

Assistant:

static char_t* parse_wnorm(char_t* s, char_t end_quote)
		{
			gap g;

			// trim leading whitespaces
			if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			{
				char_t* str = s;

				do ++str;
				while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

				g.push(s, str - s);
			}

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws | ct_space));

				if (*s == end_quote)
				{
					char_t* str = g.flush(s);

					do *str-- = 0;
					while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space));

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					*s++ = ' ';

					if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
					{
						char_t* str = s + 1;
						while (PUGI_IMPL_IS_CHARTYPE(*str, ct_space)) ++str;

						g.push(s, str - s);
					}
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}